

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

void set_short_option_error_details
               (dropt_context *context,dropt_error err,dropt_char shortName,
               dropt_char *optionArgument)

{
  char_array optionName;
  dropt_char shortNameBuf [3];
  
  if (shortName != '\0') {
    optionName.len = 2;
    optionName.s = shortNameBuf;
    set_error_details(context,err,optionName,optionArgument);
    return;
  }
  __assert_fail("shortName != DROPT_TEXT_LITERAL(\'\\0\')",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
                0x242,
                "void set_short_option_error_details(dropt_context *, dropt_error, dropt_char, const dropt_char *)"
               );
}

Assistant:

static void
set_short_option_error_details(dropt_context* context, dropt_error err,
                               dropt_char shortName,
                               const dropt_char* optionArgument)
{
    /* "-?" is just a placeholder. */
    dropt_char shortNameBuf[] = DROPT_TEXT_LITERAL("-?");

    assert(context != NULL);
    assert(shortName != DROPT_TEXT_LITERAL('\0'));

    shortNameBuf[1] = shortName;

    set_error_details(context, err,
                      make_char_array(shortNameBuf,
                                      ARRAY_LENGTH(shortNameBuf) - 1),
                      optionArgument);
}